

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

uchar * glfwGetJoystickButtons(int jid,int *count)

{
  GLFWbool GVar1;
  int iVar2;
  int *in_RSI;
  uint in_EDI;
  _GLFWjoystick *js;
  undefined4 in_stack_fffffffffffffff0;
  uchar *local_8;
  
  *in_RSI = 0;
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    local_8 = (uchar *)0x0;
  }
  else if (((int)in_EDI < 0) || (0xf < (int)in_EDI)) {
    _glfwInputError(0x10003,"Invalid joystick ID %i",(ulong)in_EDI);
    local_8 = (uchar *)0x0;
  }
  else {
    GVar1 = initJoysticks();
    if (GVar1 == 0) {
      local_8 = (uchar *)0x0;
    }
    else if (_glfw.joysticks[(int)in_EDI].present == 0) {
      local_8 = (uchar *)0x0;
    }
    else {
      iVar2 = _glfwPlatformPollJoystick
                        ((_GLFWjoystick *)CONCAT44(in_EDI,in_stack_fffffffffffffff0),
                         (int)((ulong)in_RSI >> 0x20));
      if (iVar2 == 0) {
        local_8 = (uchar *)0x0;
      }
      else {
        if (_glfw.hints.init.hatButtons == 0) {
          *in_RSI = _glfw.joysticks[(int)in_EDI].buttonCount;
        }
        else {
          *in_RSI = _glfw.joysticks[(int)in_EDI].buttonCount +
                    _glfw.joysticks[(int)in_EDI].hatCount * 4;
        }
        local_8 = _glfw.joysticks[(int)in_EDI].buttons;
      }
    }
  }
  return local_8;
}

Assistant:

char* glfwGetJoystickButtons(int jid, int* count)
{
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);
    assert(count != NULL);

    *count = 0;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (jid < 0 || jid > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick ID %i", jid);
        return NULL;
    }

    if (!initJoysticks())
        return NULL;

    js = _glfw.joysticks + jid;
    if (!js->present)
        return NULL;

    if (!_glfwPlatformPollJoystick(js, _GLFW_POLL_BUTTONS))
        return NULL;

    if (_glfw.hints.init.hatButtons)
        *count = js->buttonCount + js->hatCount * 4;
    else
        *count = js->buttonCount;

    return js->buttons;
}